

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector_senswrapper.c
# Opt level: O2

N_Vector N_VNew_SensWrapper(int count,N_Vector w)

{
  long lVar1;
  long *plVar2;
  N_Vector v;
  N_Vector p_Var3;
  long lVar4;
  
  v = N_VNewEmpty_SensWrapper(count);
  if (v != (N_Vector)0x0) {
    plVar2 = (long *)v->content;
    lVar4 = 0;
    do {
      if ((int)plVar2[1] <= lVar4) {
        *(undefined4 *)((long)plVar2 + 0xc) = 1;
        return v;
      }
      p_Var3 = N_VClone(w);
      *(N_Vector *)(*plVar2 + lVar4 * 8) = p_Var3;
      lVar1 = lVar4 * 8;
      lVar4 = lVar4 + 1;
    } while (*(long *)(*plVar2 + lVar1) != 0);
    N_VDestroy(v);
  }
  return (N_Vector)0x0;
}

Assistant:

N_Vector N_VNew_SensWrapper(int count, N_Vector w)
{
  N_Vector v;
  int i;

  v = NULL;
  v = N_VNewEmpty_SensWrapper(count);
  if (v == NULL) return(NULL);

  for (i=0; i < NV_NVECS_SW(v); i++) {
    NV_VEC_SW(v,i) = N_VClone(w);
    if (NV_VEC_SW(v,i) == NULL) { N_VDestroy(v); return(NULL); }
  }

  /* update own vectors status */
  NV_OWN_VECS_SW(v) = SUNTRUE;

  return(v);
}